

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *type)

{
  uint uVar1;
  uint64_t id;
  undefined2 uVar2;
  Which expectedKind;
  int iVar3;
  SegmentReader *pSVar4;
  StructPointerCount SVar5;
  CapTableReader *pCVar6;
  WirePointer *pWVar7;
  PointerReader local_80;
  StructReader local_60;
  
  uVar1 = (type->_reader).dataSize;
  if (uVar1 < 0x10) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(type->_reader).data;
  }
  switch(uVar2) {
  case 0xe:
    if ((type->_reader).pointerCount == 0) {
      local_80.nestingLimit = 0x7fffffff;
      local_80.capTable = (CapTableReader *)0x0;
      local_80.pointer = (WirePointer *)0x0;
      local_80.segment = (SegmentReader *)0x0;
    }
    else {
      local_80.nestingLimit = (type->_reader).nestingLimit;
      local_80.pointer = (type->_reader).pointers;
      local_80.segment = (type->_reader).segment;
      local_80.capTable = (type->_reader).capTable;
    }
    capnp::_::PointerReader::getStruct(&local_60,&local_80,(word *)0x0);
    validate(this,(Reader *)&local_60);
    return;
  case 0xf:
    SVar5 = (type->_reader).pointerCount;
    if (uVar1 < 0x80) {
      id = 0;
    }
    else {
      id = *(uint64_t *)((long)(type->_reader).data + 8);
    }
    pSVar4 = (type->_reader).segment;
    pCVar6 = (type->_reader).capTable;
    pWVar7 = (type->_reader).pointers;
    iVar3 = (type->_reader).nestingLimit;
    expectedKind = ENUM;
    break;
  case 0x10:
    SVar5 = (type->_reader).pointerCount;
    if (uVar1 < 0x80) {
      id = 0;
    }
    else {
      id = *(uint64_t *)((long)(type->_reader).data + 8);
    }
    pSVar4 = (type->_reader).segment;
    pCVar6 = (type->_reader).capTable;
    pWVar7 = (type->_reader).pointers;
    iVar3 = (type->_reader).nestingLimit;
    expectedKind = STRUCT;
    break;
  case 0x11:
    SVar5 = (type->_reader).pointerCount;
    if (uVar1 < 0x80) {
      id = 0;
    }
    else {
      id = *(uint64_t *)((long)(type->_reader).data + 8);
    }
    pSVar4 = (type->_reader).segment;
    pCVar6 = (type->_reader).capTable;
    pWVar7 = (type->_reader).pointers;
    iVar3 = (type->_reader).nestingLimit;
    expectedKind = INTERFACE;
    break;
  default:
    goto switchD_00183465_default;
  }
  validateTypeId(this,id,expectedKind);
  if (SVar5 == 0) {
    iVar3 = 0x7fffffff;
    pCVar6 = (CapTableReader *)0x0;
    pWVar7 = (WirePointer *)0x0;
    pSVar4 = (SegmentReader *)0x0;
  }
  local_80.segment = pSVar4;
  local_80.capTable = pCVar6;
  local_80.pointer = pWVar7;
  local_80.nestingLimit = iVar3;
  capnp::_::PointerReader::getStruct(&local_60,&local_80,(word *)0x0);
  validate(this,(Reader *)&local_60);
switchD_00183465_default:
  return;
}

Assistant:

void validate(const schema::Type::Reader& type) {
    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::ANY_POINTER:
        break;

      case schema::Type::STRUCT: {
        auto structType = type.getStruct();
        validateTypeId(structType.getTypeId(), schema::Node::STRUCT);
        validate(structType.getBrand());
        break;
      }
      case schema::Type::ENUM: {
        auto enumType = type.getEnum();
        validateTypeId(enumType.getTypeId(), schema::Node::ENUM);
        validate(enumType.getBrand());
        break;
      }
      case schema::Type::INTERFACE: {
        auto interfaceType = type.getInterface();
        validateTypeId(interfaceType.getTypeId(), schema::Node::INTERFACE);
        validate(interfaceType.getBrand());
        break;
      }

      case schema::Type::LIST:
        validate(type.getList().getElementType());
        break;
    }

    // We intentionally allow unknown types.
  }